

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_spike.cpp
# Opt level: O0

int AF_A_ThrustLower(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  FState *pFVar1;
  bool bVar2;
  bool local_56;
  bool local_53;
  FName local_50;
  FName local_4c;
  void *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                  ,0x8b,"int AF_A_ThrustLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (stateowner != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                    ,0x8b,"int AF_A_ThrustLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                      ,0x8b,"int AF_A_ThrustLower(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_56 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_56 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_56 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                      ,0x8b,"int AF_A_ThrustLower(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar2 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar2 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                      ,0x8b,"int AF_A_ThrustLower(VMFrameStack *, VMValue *, int, VMReturn *, int)")
        ;
      }
      local_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      local_48 = (void *)0x0;
    }
    bVar2 = A_SinkMobj(stateowner,6.0);
    this = stateowner;
    if (bVar2) {
      stateowner->args[0] = 0;
      if (stateowner->args[1] == 0) {
        FName::FName(&local_50,"ThrustInit1");
        pFVar1 = AActor::FindState(this,&local_50);
        AActor::SetState(this,pFVar1,true);
      }
      else {
        FName::FName(&local_4c,"BloodThrustInit1");
        pFVar1 = AActor::FindState(this,&local_4c);
        AActor::SetState(this,pFVar1,true);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                ,0x8b,"int AF_A_ThrustLower(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrustLower)
{
	PARAM_ACTION_PROLOGUE;

	if (A_SinkMobj (self, 6))
	{
		self->args[0] = 0;
		if (self->args[1])
			self->SetState (self->FindState ("BloodThrustInit1"), true);
		else
			self->SetState (self->FindState ("ThrustInit1"), true);
	}
	return 0;
}